

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int *activateScaling)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  double __x;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int expTmp;
  int local_5c;
  double *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  
  iVar5 = this->kCategoryCount;
  if (0 < iVar5) {
    iVar7 = 0;
    iVar6 = this->kPatternCount;
    iVar12 = this->kPartialsPaddedStateCount;
    iVar9 = iVar12;
    local_58 = partials1;
    local_50 = partials2;
    local_48 = destP;
    local_40 = matrices1;
    local_38 = matrices2;
    do {
      if (0 < iVar6) {
        uVar13 = this->kStateCount;
        iVar5 = 0;
        uVar10 = iVar9 * iVar7 * iVar6;
        uVar11 = (ulong)uVar10;
        do {
          pdVar4 = local_50;
          pdVar3 = local_58;
          if (0 < (int)uVar13) {
            uVar11 = (ulong)(int)uVar11;
            iVar12 = 0;
            iVar6 = this->kMatrixSize * iVar7;
            do {
              if ((int)uVar13 < 1) {
                __x = 0.0;
              }
              else {
                auVar14 = ZEXT816(0);
                auVar15 = ZEXT864(0) << 0x40;
                uVar8 = 0;
                do {
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = local_40[(long)iVar6 + uVar8];
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = local_38[(long)iVar6 + uVar8];
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = pdVar3[(long)(int)uVar10 + uVar8];
                  auVar1 = vfmadd231sd_fma(auVar15._0_16_,auVar16,auVar1);
                  auVar15 = ZEXT1664(auVar1);
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = pdVar4[(long)(int)uVar10 + uVar8];
                  auVar14 = vfmadd231sd_fma(auVar14,auVar17,auVar2);
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
                __x = auVar1._0_8_ * auVar14._0_8_;
                iVar6 = iVar6 + uVar13;
              }
              destP[uVar11] = __x;
              if (*activateScaling == 0) {
                frexp(__x,&local_5c);
                iVar9 = -local_5c;
                if (0 < local_5c) {
                  iVar9 = local_5c;
                }
                destP = local_48;
                if (this->scalingExponentThreshold < iVar9) {
                  *activateScaling = 1;
                  uVar13 = this->kStateCount;
                }
              }
              iVar6 = iVar6 + 1;
              uVar11 = uVar11 + 1;
              iVar12 = iVar12 + 1;
            } while (iVar12 < (int)uVar13);
            iVar6 = this->kPatternCount;
            iVar12 = this->kPartialsPaddedStateCount;
          }
          uVar10 = uVar10 + iVar12;
          iVar5 = iVar5 + 1;
        } while (iVar5 < iVar6);
        iVar5 = this->kCategoryCount;
        iVar9 = iVar12;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}